

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

string * __thiscall
t_st_generator::function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_st_generator *this,t_function *tfunction)

{
  string *psVar1;
  t_struct *tstruct;
  string local_b0;
  string local_90;
  string local_60;
  string local_40;
  t_function *local_20;
  t_function *tfunction_local;
  t_st_generator *this_local;
  
  local_20 = tfunction;
  tfunction_local = (t_function *)this;
  this_local = (t_st_generator *)__return_storage_ptr__;
  psVar1 = t_function::get_name_abi_cxx11_(tfunction);
  std::__cxx11::string::string((string *)&local_60,(string *)psVar1);
  t_generator::camelcase(&local_40,(t_generator *)this,&local_60);
  tstruct = t_function::get_arglist(local_20);
  argument_list_abi_cxx11_(&local_b0,this,tstruct);
  t_generator::capitalize(&local_90,(t_generator *)this,&local_b0);
  std::operator+(__return_storage_ptr__,&local_40,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::function_signature(t_function* tfunction) {
  return camelcase(tfunction->get_name()) + capitalize(argument_list(tfunction->get_arglist()));
}